

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Bool CanPrune(TidyDocImpl *doc,Node *element)

{
  Bool BVar1;
  AttVal *pAVar2;
  Node *element_local;
  TidyDocImpl *doc_local;
  
  if ((int)(doc->config).value[0xf].v == 0) {
    doc_local._4_4_ = no;
  }
  else {
    BVar1 = prvTidynodeIsText(element);
    if (BVar1 == no) {
      if (element->content == (Node *)0x0) {
        if (element->tag == (Dict *)0x0) {
          doc_local._4_4_ = no;
        }
        else if (((element->tag->model & 8) == 0) || (element->attributes == (AttVal *)0x0)) {
          if ((element == (Node *)0x0) ||
             (((element->tag == (Dict *)0x0 || (element->tag->id != TidyTag_A)) ||
              (element->attributes == (AttVal *)0x0)))) {
            if ((((element == (Node *)0x0) || (element->tag == (Dict *)0x0)) ||
                (element->tag->id != TidyTag_P)) || ((int)(doc->config).value[0x10].v != 0)) {
              if ((element->tag->model & 0x200) == 0) {
                if ((element->tag->model & 1) == 0) {
                  if (((element == (Node *)0x0) || (element->tag == (Dict *)0x0)) ||
                     (element->tag->id != TidyTag_APPLET)) {
                    if (((element == (Node *)0x0) || (element->tag == (Dict *)0x0)) ||
                       (element->tag->id != TidyTag_OBJECT)) {
                      if (((element != (Node *)0x0) && (element->tag != (Dict *)0x0)) &&
                         ((element->tag->id == TidyTag_SCRIPT &&
                          (pAVar2 = prvTidyAttrGetById(element,TidyAttr_SRC),
                          pAVar2 != (AttVal *)0x0)))) {
                        return no;
                      }
                      if (((element == (Node *)0x0) || (element->tag == (Dict *)0x0)) ||
                         (element->tag->id != TidyTag_TITLE)) {
                        if (((element == (Node *)0x0) || (element->tag == (Dict *)0x0)) ||
                           (element->tag->id != TidyTag_IFRAME)) {
                          if (((element == (Node *)0x0) || (element->tag == (Dict *)0x0)) ||
                             (element->tag->id != TidyTag_TEXTAREA)) {
                            if (((element == (Node *)0x0) || (element->tag == (Dict *)0x0)) ||
                               (element->tag->id != TidyTag_CANVAS)) {
                              if (((element == (Node *)0x0) || (element->tag == (Dict *)0x0)) ||
                                 (element->tag->id != TidyTag_PROGRESS)) {
                                pAVar2 = prvTidyAttrGetById(element,TidyAttr_ID);
                                if ((pAVar2 == (AttVal *)0x0) &&
                                   (pAVar2 = prvTidyAttrGetById(element,TidyAttr_NAME),
                                   pAVar2 == (AttVal *)0x0)) {
                                  pAVar2 = prvTidyAttrGetById(element,TidyAttr_DATAFLD);
                                  if (pAVar2 != (AttVal *)0x0) {
                                    return no;
                                  }
                                  if (element->tag->id == TidyTag_UNKNOWN) {
                                    return no;
                                  }
                                  if (((element != (Node *)0x0) && (element->tag != (Dict *)0x0)) &&
                                     (element->tag->id == TidyTag_BODY)) {
                                    return no;
                                  }
                                  if (((element != (Node *)0x0) && (element->tag != (Dict *)0x0)) &&
                                     (element->tag->id == TidyTag_COLGROUP)) {
                                    return no;
                                  }
                                  if (((element != (Node *)0x0) && (element->tag != (Dict *)0x0)) &&
                                     ((element->tag->id == TidyTag_OPTION &&
                                      (element->attributes != (AttVal *)0x0)))) {
                                    return no;
                                  }
                                  if (((element != (Node *)0x0) && (element->tag != (Dict *)0x0)) &&
                                     (element->tag->id == TidyTag_DD)) {
                                    return no;
                                  }
                                  return yes;
                                }
                                doc_local._4_4_ = no;
                              }
                              else {
                                doc_local._4_4_ = no;
                              }
                            }
                            else {
                              doc_local._4_4_ = no;
                            }
                          }
                          else {
                            doc_local._4_4_ = no;
                          }
                        }
                        else {
                          doc_local._4_4_ = no;
                        }
                      }
                      else {
                        doc_local._4_4_ = no;
                      }
                    }
                    else {
                      doc_local._4_4_ = no;
                    }
                  }
                  else {
                    doc_local._4_4_ = no;
                  }
                }
                else {
                  doc_local._4_4_ = no;
                }
              }
              else {
                doc_local._4_4_ = no;
              }
            }
            else {
              doc_local._4_4_ = no;
            }
          }
          else {
            doc_local._4_4_ = no;
          }
        }
        else {
          doc_local._4_4_ = no;
        }
      }
      else {
        doc_local._4_4_ = no;
      }
    }
    else {
      doc_local._4_4_ = yes;
    }
  }
  return doc_local._4_4_;
}

Assistant:

static Bool CanPrune( TidyDocImpl* doc, Node *element )
{
    if ( !cfgBool(doc, TidyDropEmptyElems) )
        return no;

    if ( TY_(nodeIsText)(element) )
        return yes;

    if ( element->content )
        return no;

    if ( element->tag == NULL )
        return no;

    if ( element->tag->model & CM_BLOCK && element->attributes != NULL )
        return no;

    if ( nodeIsA(element) && element->attributes != NULL )
        return no;

    if ( nodeIsP(element) && !cfgBool(doc, TidyDropEmptyParas) )
        return no;

    if ( element->tag->model & CM_ROW )
        return no;

    if ( element->tag->model & CM_EMPTY )
        return no;

    if ( nodeIsAPPLET(element) )
        return no;

    if ( nodeIsOBJECT(element) )
        return no;

    if ( nodeIsSCRIPT(element) && attrGetSRC(element) )
        return no;

    if ( nodeIsTITLE(element) )
        return no;

    /* #433359 - fix by Randy Waki 12 Mar 01 */
    if ( nodeIsIFRAME(element) )
        return no;

    /* fix for bug 770297 */
    if (nodeIsTEXTAREA(element))
        return no;

    /* fix for ISSUE #7 https://github.com/w3c/tidy-html5/issues/7 */
    if (nodeIsCANVAS(element))
        return no;
    
    if (nodeIsPROGRESS(element))
        return no;

    if ( attrGetID(element) || attrGetNAME(element) )
        return no;

    /* fix for bug 695408; a better fix would look for unknown and    */
    /* known proprietary attributes that make the element significant */
    if (attrGetDATAFLD(element))
        return no;

    /* fix for bug 723772, don't trim new-...-tags */
    if (element->tag->id == TidyTag_UNKNOWN)
        return no;

    if (nodeIsBODY(element))
        return no;

    if (nodeIsCOLGROUP(element))
        return no;

    /* HTML5 - do NOT drop empty option if it has attributes */
    if ( nodeIsOPTION(element) && element->attributes != NULL )
        return no;

    /* fix for #103 - don't drop empty dd tags lest document not validate */
    if (nodeIsDD(element))
        return no;

    return yes;
}